

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

void __thiscall QHybrid::Load(QHybrid *this,string *filename)

{
  long lVar1;
  byte bVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 uVar5;
  string *in_RSI;
  QHybrid *in_RDI;
  stringstream ss_2;
  stringstream ss_1;
  istringstream is;
  string buffer;
  stringstream ss1;
  ifstream fp;
  stringstream ss;
  string *in_stack_fffffffffffff508;
  long *plVar6;
  E *in_stack_fffffffffffff510;
  string local_a90 [32];
  stringstream local_a70 [16];
  ostream local_a60 [48];
  QHybrid *in_stack_fffffffffffff5d0;
  string local_8e8 [32];
  stringstream local_8c8 [16];
  ostream local_8b8 [376];
  istringstream local_740 [136];
  QTable *in_stack_fffffffffffff948;
  size_t in_stack_fffffffffffff950;
  size_t in_stack_fffffffffffff958;
  string *in_stack_fffffffffffff960;
  string local_5c0 [39];
  undefined1 local_599;
  string local_578 [32];
  stringstream local_558 [16];
  ostream local_548 [376];
  string local_3d0 [32];
  long local_3b0 [67];
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  
  local_10 = in_RSI;
  if (in_RDI->_m_horizonLastTimeSteps == 0) {
    SetOptimizedHorLast(in_RDI,true);
    std::__cxx11::stringstream::stringstream(local_198);
    poVar3 = std::operator<<(local_188,local_10);
    std::operator<<(poVar3,"_horLast");
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_3b0,pcVar4,_S_in);
    std::__cxx11::string::~string(local_3d0);
    bVar2 = std::ios::operator!((ios *)((long)local_3b0 + *(long *)(local_3b0[0] + -0x18)));
    if ((bVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_558);
      poVar3 = std::operator<<(local_548,"QHybrid::Load: failed to ");
      poVar3 = std::operator<<(poVar3,"open file ");
      std::__cxx11::stringstream::str();
      std::operator<<(poVar3,local_578);
      std::__cxx11::string::~string(local_578);
      local_599 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      E::E(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      local_599 = 0;
      __cxa_throw(uVar5,&E::typeinfo,E::~E);
    }
    std::__cxx11::string::string(local_5c0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_3b0,local_5c0);
    std::__cxx11::istringstream::istringstream(local_740,local_5c0,_S_in);
    std::istream::operator>>(local_740,&in_RDI->_m_horizonLastTimeSteps);
    std::__cxx11::istringstream::~istringstream(local_740);
    std::__cxx11::string::~string(local_5c0);
    std::ifstream::~ifstream(local_3b0);
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  else {
    SetOptimizedHorLast(in_RDI,false);
  }
  if ((in_RDI->_m_initialized & 1U) == 0) {
    Initialize(in_stack_fffffffffffff5d0);
  }
  std::__cxx11::stringstream::stringstream(local_8c8);
  poVar3 = std::operator<<(local_8b8,local_10);
  std::operator<<(poVar3,"_firstTS");
  std::__cxx11::stringstream::str();
  lVar1 = *(long *)((long)in_RDI->super_QFunctionJAOHInterface + -0x88);
  (**(code **)(*(long *)(&(in_RDI->super_QFunctionJAOHInterface).field_0x0 + lVar1) + 0x60))
            (&(in_RDI->super_QFunctionJAOHInterface).field_0x0 + lVar1);
  PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8a57b1);
  QTable::Load(in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950,
               in_stack_fffffffffffff948);
  std::__cxx11::string::~string(local_8e8);
  std::__cxx11::stringstream::~stringstream(local_8c8);
  std::__cxx11::stringstream::stringstream(local_a70);
  poVar3 = std::operator<<(local_a60,local_10);
  std::operator<<(poVar3,"_lastTS");
  plVar6 = (long *)((long)&in_RDI->_m_QlastTimeSteps->field_0x0 +
                   *(long *)((long)*in_RDI->_m_QlastTimeSteps + -0x60));
  std::__cxx11::stringstream::str();
  (**(code **)(*plVar6 + 0x28))(plVar6,local_a90);
  std::__cxx11::string::~string(local_a90);
  std::__cxx11::stringstream::~stringstream(local_a70);
  return;
}

Assistant:

void QHybrid::Load(const std::string& filename)
{
    // figure out what _m_horizonLastTimeSteps should be by reading it from disk
    if(_m_horizonLastTimeSteps==0)
    {
        SetOptimizedHorLast(true);
        stringstream ss;
        ss << filename << "_horLast";
        ifstream fp(ss.str().c_str());
        if(!fp)
        {
            stringstream ss1;
            ss1 << "QHybrid::Load: failed to "
               << "open file " << ss.str();
            throw(E(ss1.str()));
        }
        string buffer;
        getline(fp,buffer);
        istringstream is(buffer);
        is >> _m_horizonLastTimeSteps;
    }
    else
        SetOptimizedHorLast(false);

    if(!_m_initialized)
        Initialize();

    {
        stringstream ss;
        ss << filename << "_firstTS";
        QTable::Load(ss.str(),
                     _m_nrJAOHinFirstTS,
                     GetPU()->GetNrJointActions(),
                     _m_QValuesFirstTimeSteps);
    }
    {
        stringstream ss;
        ss << filename << "_lastTS";
        _m_QlastTimeSteps->Load(ss.str());
    }
}